

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

double xmlXPathCastToNumberInternal(xmlXPathParserContextPtr ctxt,xmlXPathObjectPtr val)

{
  xmlChar *val_00;
  xmlChar *str;
  double ret;
  xmlXPathObjectPtr val_local;
  xmlXPathParserContextPtr ctxt_local;
  
  str = (xmlChar *)0x0;
  if (val == (xmlXPathObjectPtr)0x0) {
    ctxt_local = (xmlXPathParserContextPtr)xmlXPathNAN;
  }
  else {
    switch(val->type) {
    case XPATH_UNDEFINED:
      str = (xmlChar *)xmlXPathNAN;
      break;
    case XPATH_NODESET:
    case XPATH_XSLT_TREE:
      val_00 = xmlXPathCastNodeSetToString(val->nodesetval);
      if (val_00 == (xmlChar *)0x0) {
        xmlXPathPErrMemory(ctxt);
        str = (xmlChar *)xmlXPathNAN;
      }
      else {
        str = (xmlChar *)xmlXPathCastStringToNumber(val_00);
        (*xmlFree)(val_00);
      }
      break;
    case XPATH_BOOLEAN:
      str = (xmlChar *)xmlXPathCastBooleanToNumber(val->boolval);
      break;
    case XPATH_NUMBER:
      str = (xmlChar *)val->floatval;
      break;
    case XPATH_STRING:
      str = (xmlChar *)xmlXPathCastStringToNumber(val->stringval);
      break;
    case XPATH_USERS:
      str = (xmlChar *)xmlXPathNAN;
    }
    ctxt_local = (xmlXPathParserContextPtr)str;
  }
  return (double)ctxt_local;
}

Assistant:

static double
xmlXPathCastToNumberInternal(xmlXPathParserContextPtr ctxt,
                             xmlXPathObjectPtr val) {
    double ret = 0.0;

    if (val == NULL)
	return(xmlXPathNAN);
    switch (val->type) {
    case XPATH_UNDEFINED:
	ret = xmlXPathNAN;
	break;
    case XPATH_NODESET:
    case XPATH_XSLT_TREE: {
        xmlChar *str;

	str = xmlXPathCastNodeSetToString(val->nodesetval);
        if (str == NULL) {
            xmlXPathPErrMemory(ctxt);
            ret = xmlXPathNAN;
        } else {
	    ret = xmlXPathCastStringToNumber(str);
            xmlFree(str);
        }
	break;
    }
    case XPATH_STRING:
	ret = xmlXPathCastStringToNumber(val->stringval);
	break;
    case XPATH_NUMBER:
	ret = val->floatval;
	break;
    case XPATH_BOOLEAN:
	ret = xmlXPathCastBooleanToNumber(val->boolval);
	break;
    case XPATH_USERS:
	/* TODO */
	ret = xmlXPathNAN;
	break;
    }
    return(ret);
}